

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_mt.c
# Opt level: O2

void run_test_evict(VMEMcache *cache,uint n_threads,os_thread_t *threads,uint ops_per_thread,
                   context *ctx,int by_key)

{
  FILE *__stream;
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  code *pcVar4;
  char *pcVar5;
  ulong local_40;
  int local_34;
  
  local_34 = by_key;
  free_cache(cache);
  local_40 = 0;
  while( true ) {
    if (n_threads <= local_40) {
      for (lVar3 = 0; (ulong)n_threads * 0x28 - lVar3 != 0; lVar3 = lVar3 + 0x28) {
        *(code **)((long)&ctx->worker + lVar3) = worker_thread_test_evict_get;
        *(uint *)((long)&ctx->ops_count + lVar3) = ops_per_thread;
      }
      pcVar4 = worker_thread_test_evict_by_key;
      if (local_34 == 0) {
        pcVar4 = worker_thread_test_evict_by_LRU;
      }
      pcVar5 = "_by_key";
      if (local_34 == 0) {
        pcVar5 = "_by_LRU";
      }
      ctx[n_threads - 1].worker = pcVar4;
      printf("%s%s: STARTED\n","run_test_evict",pcVar5);
      LOCK();
      keep_running = 1;
      UNLOCK();
      run_threads(n_threads,threads,ctx);
      free_cache(cache);
      printf("%s%s: PASSED\n","run_test_evict",pcVar5);
      return;
    }
    iVar1 = vmemcache_put(ctx->cache,&local_40,8,&local_40,8);
    if (iVar1 != 0) break;
    local_40 = local_40 + 1;
  }
  fprintf(_stderr,"FATAL ERROR at %s:%i in %s(): ",
          "/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/tests/vmemcache_test_mt.c"
          ,0x1df,"run_test_evict");
  __stream = _stderr;
  uVar2 = vmemcache_errormsg();
  fprintf(__stream,"ERROR: vmemcache_put: %s",uVar2);
  fputc(10,_stderr);
  abort();
}

Assistant:

static void
run_test_evict(VMEMcache *cache, unsigned n_threads, os_thread_t *threads,
		unsigned ops_per_thread, struct context *ctx, int by_key)
{
	free_cache(cache);

	for (unsigned long long n = 0; n < n_threads; ++n) {
		if (vmemcache_put(ctx->cache, &n, sizeof(n), &n, sizeof(n)))
			UT_FATAL("ERROR: vmemcache_put: %s",
					vmemcache_errormsg());
	}

	for (unsigned i = 0; i < n_threads; ++i) {
		ctx[i].worker = worker_thread_test_evict_get;
		ctx[i].ops_count = ops_per_thread;
	}

	/* overwrite the last routine */
	if (by_key)
		ctx[n_threads - 1].worker = worker_thread_test_evict_by_key;
	else
		ctx[n_threads - 1].worker = worker_thread_test_evict_by_LRU;

	printf("%s%s: STARTED\n", __func__, by_key ? "_by_key" : "_by_LRU");

	__atomic_store_n(&keep_running, 1, __ATOMIC_SEQ_CST);
	run_threads(n_threads, threads, ctx);

	/* success of this function is the main success criteria of this test */
	free_cache(cache);

	printf("%s%s: PASSED\n", __func__, by_key ? "_by_key" : "_by_LRU");
}